

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
WriteSparseVec<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SingleSparseVecWrtFactory<int,double>,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
          (ExampleNLFeeder *this,SingleSparseVecWrtFactory<int,_double> *gw,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  bool bVar1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDX;
  SparseVectorWriter<int,_double> *in_RSI;
  pair<int,_double> v;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range2;
  SparseVectorWriter<int,_double> gvw;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffffa0;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_38;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_30;
  SparseVectorWriter<int,_double> local_28;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size(in_RDX);
  mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
  SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_30 = local_18;
  local_38._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_RSI,
                       (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator*(&local_38);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
    SparseVectorWriter<int,_double>::Write(in_RSI,in_stack_ffffffffffffff8c,5.64726914509462e-318);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(&local_38);
  }
  mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
  SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_28);
  return;
}

Assistant:

void WriteSparseVec(GradWriterFactory& gw, const SparseVec& vec) {
    auto gvw = gw.MakeVectorWriter(vec.size());
    for (auto v: vec)
      gvw.Write(v.first, v.second);
  }